

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

ctl_named_node_t * experimental_arenas_i_index(tsdn_t *tsdn,size_t *mib,size_t miblen,size_t i)

{
  _Bool _Var1;
  ctl_named_node_t *pcVar2;
  
  malloc_mutex_lock(tsdn,&ctl_mtx);
  _Var1 = ctl_arenas_i_verify(i);
  pcVar2 = (ctl_named_node_t *)0x0;
  if (!_Var1) {
    pcVar2 = super_experimental_arenas_i_node;
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return pcVar2;
}

Assistant:

static const ctl_named_node_t *
experimental_arenas_i_index(tsdn_t *tsdn, const size_t *mib,
    size_t miblen, size_t i) {
	const ctl_named_node_t *ret;

	malloc_mutex_lock(tsdn, &ctl_mtx);
	if (ctl_arenas_i_verify(i)) {
		ret = NULL;
		goto label_return;
	}
	ret = super_experimental_arenas_i_node;
label_return:
	malloc_mutex_unlock(tsdn, &ctl_mtx);
	return ret;
}